

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form5_Histogram(HistogramForm5 Histogram)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  uint8_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  size_type sVar5;
  const_reference pvVar6;
  code *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image mask;
  Image image;
  uint8_t intensity;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint32_t in_stack_fffffffffffffee8;
  uint32_t in_stack_fffffffffffffeec;
  value_type in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint32_t in_stack_ffffffffffffff04;
  uint32_t in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined2 uVar7;
  uint32_t in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  ImageTemplate<unsigned_char> local_a0;
  undefined4 local_78;
  ImageTemplate<unsigned_char> local_40;
  byte local_11;
  code *local_10;
  byte local_1;
  
  uVar7 = (undefined2)((uint)in_stack_ffffffffffffff0c >> 0x10);
  local_10 = in_RDI;
  local_11 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffeec
             ,in_stack_fffffffffffffee8,(uint8_t)((ulong)in_stack_fffffffffffffee0 >> 0x38),
             (uint8_t)((ulong)in_stack_fffffffffffffee0 >> 0x30));
  Test_Helper::uniformImage
            ((uint8_t)((ushort)uVar7 >> 8),in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
             (Image *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d7345);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_40);
  if (uVar2 >> 1 == 0) {
    local_1 = 1;
    local_78 = 1;
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_40);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_40);
    uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_40);
    PenguinV_Image::ImageTemplate<unsigned_char>::generate
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(uVar2,CONCAT13(uVar1,(int3)in_stack_ffffffffffffff18)),
               in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,(uint8_t)((ushort)uVar7 >> 8),
               (uint8_t)uVar7);
    PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_a0);
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_a0);
    Unit_Test::fillImage
              ((Image *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
               (uint32_t)((ulong)in_stack_fffffffffffffee0 >> 0x20),
               (uint32_t)in_stack_fffffffffffffee0,
               (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18));
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_a0);
    PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_a0);
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_a0);
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_a0);
    Unit_Test::fillImage
              ((Image *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
               (uint32_t)((ulong)in_stack_fffffffffffffee0 >> 0x20),
               (uint32_t)in_stack_fffffffffffffee0,
               (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18));
    (*local_10)(&local_b8,&local_40,&local_a0);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b8);
    local_1 = false;
    if (sVar5 == 0x100) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_b8,(ulong)local_11);
      in_stack_fffffffffffffef0 = *pvVar6;
      in_stack_fffffffffffffef4 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_40);
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_40);
      local_1 = false;
      if (in_stack_fffffffffffffef0 == in_stack_fffffffffffffef4 * (uVar2 >> 1)) {
        __first._M_current = (uint *)&local_b8;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        __last._M_current._4_4_ = in_stack_fffffffffffffedc;
        __last._M_current._0_4_ = in_stack_fffffffffffffed8;
        uVar3 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                          (__first,__last,0);
        uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_40);
        uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_40);
        local_1 = uVar3 == uVar2 * (uVar4 >> 1);
      }
    }
    local_78 = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1d762f);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d7681);
  return (bool)(local_1 & 1);
}

Assistant:

bool form5_Histogram(HistogramForm5 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        if ( image.height() / 2 == 0 )
            return true;

        PenguinV_Image::Image mask = image.generate( image.width(), image.height(), image.colorCount() );
        fillImage( mask, 0, 0, mask.width(), mask.height() / 2, 255 );
        fillImage( mask, 0, mask.height() / 2, mask.width(), mask.height() - mask.height() / 2, 0 );

        const std::vector < uint32_t > histogram = Histogram( image, mask );

        return histogram.size() == 256u && histogram[intensity] == image.width() * (image.height() / 2) &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == image.width() * (image.height() / 2);
    }